

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

RealType __thiscall OpenMD::Snapshot::getLongRangePotential(Snapshot *this)

{
  double *pdVar1;
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if ((*(byte *)(in_RDI + 0xa76) & 1) == 0) {
    *(undefined8 *)(in_RDI + 0x6b0) = 0;
    for (local_c = 0; (int)local_c < 7; local_c = local_c + 1) {
      pdVar1 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 0x6e8),local_c);
      *(double *)(in_RDI + 0x6b0) = *pdVar1 + *(double *)(in_RDI + 0x6b0);
    }
    *(double *)(in_RDI + 0x6b0) = *(double *)(in_RDI + 0x6b8) + *(double *)(in_RDI + 0x6b0);
    *(double *)(in_RDI + 0x6b0) = *(double *)(in_RDI + 0x6c0) + *(double *)(in_RDI + 0x6b0);
    *(undefined1 *)(in_RDI + 0xa76) = 1;
    *(undefined1 *)(in_RDI + 0xa79) = 0;
    *(undefined1 *)(in_RDI + 0xa70) = 0;
  }
  return *(RealType *)(in_RDI + 0x6b0);
}

Assistant:

RealType Snapshot::getLongRangePotential() {
    if (!hasLongRangePotential) {
      frameData.longRangePotential = 0.0;
      for (int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        frameData.longRangePotential += frameData.lrPotentials[i];
      }
      frameData.longRangePotential += frameData.reciprocalPotential;
      frameData.longRangePotential += frameData.surfacePotential;
      hasLongRangePotential = true;
      hasPotentialEnergy    = false;
      hasTotalEnergy        = false;
    }
    return frameData.longRangePotential;
  }